

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  pointer paVar1;
  pointer paVar2;
  pointer puVar3;
  pointer puVar4;
  uint *puVar5;
  pointer paVar6;
  pointer __src;
  pointer ppBVar7;
  pointer ppBVar8;
  ShapeGeometry *this_00;
  pointer ppaVar9;
  pointer ppaVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  aiAnimMesh *paVar16;
  uint uVar17;
  aiVector2D *v;
  aiMesh *out;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar19;
  aiVector3D *paVar20;
  ulong *puVar21;
  aiFace *paVar22;
  uint *puVar23;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar24;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar25;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_01;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar26;
  pointer paVar27;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar28;
  ulong uVar29;
  aiColor4D *__s;
  Skin *pSVar30;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar31
  ;
  pointer ppBVar32;
  vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
  *this_02;
  const_reference ppSVar33;
  const_reference pvVar34;
  const_reference pvVar35;
  uint *puVar36;
  aiAnimMesh **ppaVar37;
  reference ppaVar38;
  uint uVar39;
  pointer ppBVar40;
  size_t sVar41;
  uint i;
  size_type __n;
  long lVar42;
  FBXConverter *pFVar43;
  size_t j;
  int iVar44;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *__range3;
  long lVar45;
  ulong uVar46;
  aiFace *f;
  aiFace *paVar47;
  float fVar48;
  aiVector3t<float> aVar49;
  aiAnimMesh *animMesh;
  uint count;
  FBXConverter *local_c0;
  Model *local_b8;
  BlendShapeChannel *local_b0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_a8;
  FBXConverter *local_a0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  aiVector3D normal;
  
  local_c0 = (FBXConverter *)node_global_transform;
  local_b8 = model;
  local_a8 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             MeshGeometry::GetMaterialIndices(mesh);
  local_a0 = this;
  out = SetupEmptyMesh(this,&mesh->super_Geometry,nd);
  pvVar18 = MeshGeometry::GetVertices(mesh);
  pvVar19 = MeshGeometry::GetFaceIndexCounts(mesh);
  out->mNumVertices =
       (uint)(((long)(pvVar18->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar18->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start) / 0xc);
  paVar1 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar2 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SUB168(SEXT816((long)paVar2 - (long)paVar1) / SEXT816(0xc),0);
  uVar46 = SUB168(auVar11 * ZEXT816(0xc),0);
  if (SUB168(auVar11 * ZEXT816(0xc),8) != 0) {
    uVar46 = 0xffffffffffffffff;
  }
  paVar20 = (aiVector3D *)operator_new__(uVar46);
  lVar45 = (long)paVar2 - (long)paVar1;
  if (lVar45 != 0) {
    uVar46 = lVar45 - 0xc;
    memset(paVar20,0,(uVar46 - uVar46 % 0xc) + 0xc);
  }
  out->mVertices = paVar20;
  paVar1 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  sVar41 = (long)(pvVar18->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)paVar1;
  if (sVar41 != 0) {
    memmove(paVar20,paVar1,sVar41);
  }
  out->mNumFaces =
       (uint)((ulong)((long)(pvVar19->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(pvVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 2);
  puVar3 = (pvVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (pvVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar45 = (long)puVar3 - (long)puVar4;
  uVar46 = lVar45 >> 2;
  iVar44 = 0;
  puVar21 = (ulong *)operator_new__(-(ulong)(uVar46 >> 0x3c != 0) | lVar45 * 4 + 8U);
  paVar47 = (aiFace *)(puVar21 + 1);
  *puVar21 = uVar46;
  if (puVar3 != puVar4) {
    paVar22 = paVar47;
    do {
      paVar22->mNumIndices = 0;
      paVar22->mIndices = (uint *)0x0;
      paVar22 = paVar22 + 1;
    } while (paVar22 != paVar47 + uVar46);
  }
  out->mFaces = paVar47;
  puVar5 = (pvVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar36 = (pvVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start; puVar36 != puVar5; puVar36 = puVar36 + 1) {
    uVar17 = *puVar36;
    paVar47->mNumIndices = uVar17;
    puVar23 = (uint *)operator_new__((ulong)uVar17 * 4);
    paVar47->mIndices = puVar23;
    uVar39 = 8;
    if (uVar17 - 1 < 3) {
      uVar39 = *(uint *)(&DAT_005df870 + (ulong)(uVar17 - 1) * 4);
    }
    out->mPrimitiveTypes = uVar39 | out->mPrimitiveTypes;
    for (uVar46 = 0; uVar17 != uVar46; uVar46 = uVar46 + 1) {
      paVar47->mIndices[uVar46] = iVar44 + (int)uVar46;
    }
    iVar44 = iVar44 + (int)uVar46;
    paVar47 = paVar47 + 1;
  }
  pvVar24 = MeshGeometry::GetNormals(mesh);
  lVar45 = (long)(pvVar24->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar24->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar45 != 0) {
    paVar1 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar2 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (lVar45 != (long)paVar2 - (long)paVar1) {
      __assert_fail("normals.size() == vertices.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                    ,0x444,
                    "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
                   );
    }
    auVar12._8_8_ = 0;
    auVar12._0_8_ = SUB168(SEXT816(lVar45) / SEXT816(0xc),0);
    uVar46 = SUB168(auVar12 * ZEXT816(0xc),0);
    if (SUB168(auVar12 * ZEXT816(0xc),8) != 0) {
      uVar46 = 0xffffffffffffffff;
    }
    paVar20 = (aiVector3D *)operator_new__(uVar46);
    lVar45 = (long)paVar2 - (long)paVar1;
    if (lVar45 != 0) {
      uVar46 = lVar45 - 0xc;
      memset(paVar20,0,(uVar46 - uVar46 % 0xc) + 0xc);
    }
    out->mNormals = paVar20;
    paVar1 = (pvVar24->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    sVar41 = (long)(pvVar24->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar1;
    if (sVar41 != 0) {
      memmove(paVar20,paVar1,sVar41);
    }
  }
  pvVar25 = MeshGeometry::GetTangents(mesh);
  this_01 = MeshGeometry::GetBinormals(mesh);
  if ((pvVar25->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (pvVar25->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_start) goto LAB_004fa64d;
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this_01->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (this_01->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar45 = (long)(pvVar24->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar24->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar45 != 0) {
      this_01 = &tempBinormals;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                (this_01,lVar45 / 0xc);
      uVar17 = 0;
      while( true ) {
        uVar46 = (ulong)uVar17;
        paVar1 = (pvVar25->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        lVar45 = (long)(pvVar25->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar1;
        if ((ulong)(lVar45 / 0xc) <= uVar46) break;
        aVar49 = operator^((pvVar24->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar46,paVar1 + uVar46);
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar46].x = (float)(int)aVar49._0_8_;
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar46].y =
             (float)(int)((ulong)aVar49._0_8_ >> 0x20);
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar46].z = aVar49.z;
        uVar17 = uVar17 + 1;
      }
      goto LAB_004fa4c9;
    }
  }
  else {
    lVar45 = (long)(pvVar25->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar25->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
LAB_004fa4c9:
    paVar1 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar2 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar42 = (long)paVar2 - (long)paVar1;
    if (lVar45 != lVar42) {
      __assert_fail("tangents.size() == vertices.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                    ,0x461,
                    "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
                   );
    }
    if ((long)(this_01->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this_01->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start != lVar45) {
      __assert_fail("binormals->size() == vertices.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                    ,0x462,
                    "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
                   );
    }
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SUB168(SEXT816(lVar42) / SEXT816(0xc),0);
    uVar46 = SUB168(auVar13 * ZEXT816(0xc),0);
    if (SUB168(auVar13 * ZEXT816(0xc),8) != 0) {
      uVar46 = 0xffffffffffffffff;
    }
    paVar20 = (aiVector3D *)operator_new__(uVar46);
    lVar45 = (long)paVar2 - (long)paVar1;
    if (lVar45 != 0) {
      uVar46 = lVar45 - 0xc;
      memset(paVar20,0,(uVar46 - uVar46 % 0xc) + 0xc);
    }
    out->mTangents = paVar20;
    paVar1 = (pvVar25->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    sVar41 = (long)(pvVar25->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar1;
    if (sVar41 != 0) {
      memmove(paVar20,paVar1,sVar41);
    }
    paVar1 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar2 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SUB168(SEXT816((long)paVar2 - (long)paVar1) / SEXT816(0xc),0);
    uVar46 = SUB168(auVar14 * ZEXT816(0xc),0);
    if (SUB168(auVar14 * ZEXT816(0xc),8) != 0) {
      uVar46 = 0xffffffffffffffff;
    }
    paVar20 = (aiVector3D *)operator_new__(uVar46);
    lVar45 = (long)paVar2 - (long)paVar1;
    if (lVar45 != 0) {
      uVar46 = lVar45 - 0xc;
      memset(paVar20,0,(uVar46 - uVar46 % 0xc) + 0xc);
    }
    out->mBitangents = paVar20;
    paVar1 = (this_01->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    sVar41 = (long)(this_01->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar1;
    if (sVar41 != 0) {
      memmove(paVar20,paVar1,sVar41);
    }
  }
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
LAB_004fa64d:
  for (lVar45 = 0; lVar45 != 8; lVar45 = lVar45 + 1) {
    pvVar26 = MeshGeometry::GetTextureCoords(mesh,(uint)lVar45);
    if ((pvVar26->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (pvVar26->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish) break;
    paVar1 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar2 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = SUB168(SEXT816((long)paVar2 - (long)paVar1) / SEXT816(0xc),0);
    uVar46 = SUB168(auVar15 * ZEXT816(0xc),0);
    if (SUB168(auVar15 * ZEXT816(0xc),8) != 0) {
      uVar46 = 0xffffffffffffffff;
    }
    paVar20 = (aiVector3D *)operator_new__(uVar46);
    lVar42 = (long)paVar2 - (long)paVar1;
    if (lVar42 != 0) {
      uVar46 = lVar42 - 0xc;
      memset(paVar20,0,(uVar46 - uVar46 % 0xc) + 0xc);
    }
    out->mTextureCoords[lVar45] = paVar20;
    paVar6 = (pvVar26->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (paVar27 = (pvVar26->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start; paVar27 != paVar6;
        paVar27 = paVar27 + 1) {
      fVar48 = paVar27->y;
      paVar20->x = paVar27->x;
      paVar20->y = fVar48;
      paVar20->z = 0.0;
      paVar20 = paVar20 + 1;
    }
    out->mNumUVComponents[lVar45] = 2;
  }
  lVar45 = 0;
  while( true ) {
    if (lVar45 == 8) break;
    pvVar28 = MeshGeometry::GetVertexColors(mesh,(uint)lVar45);
    if ((pvVar28->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar28->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
        super__Vector_impl_data._M_finish) break;
    paVar1 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    paVar2 = (pvVar18->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar29 = ((long)paVar1 - (long)paVar2) / 0xc;
    sVar41 = uVar29 << 4;
    uVar46 = 0xffffffffffffffff;
    if (uVar29 < 0x1000000000000000) {
      uVar46 = sVar41;
    }
    __s = (aiColor4D *)operator_new__(uVar46);
    if (paVar1 != paVar2) {
      memset(__s,0,sVar41);
    }
    out->mColors[lVar45] = __s;
    __src = (pvVar28->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
    sVar41 = (long)(pvVar28->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)__src;
    if (sVar41 != 0) {
      memmove(__s,__src,sVar41);
    }
    lVar45 = lVar45 + 1;
  }
  pFVar43 = local_a0;
  if ((local_a0->doc->settings->readMaterials == true) &&
     (paVar1 = (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     paVar1 != (local_a8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)) {
    ConvertMaterialForMesh(local_a0,out,local_b8,mesh,(value_type_conflict4)paVar1->x);
  }
  else {
    LogFunctions<Assimp::FBXImporter>::LogError((char *)0x4fa7f9);
    uVar17 = GetDefaultMaterial(pFVar43);
    out->mMaterialIndex = uVar17;
  }
  if (pFVar43->doc->settings->readWeights == true) {
    pSVar30 = Geometry::DeformerSkin(&mesh->super_Geometry);
    if (pSVar30 != (Skin *)0x0) {
      ConvertWeights(pFVar43,out,local_b8,mesh,(aiMatrix4x4 *)local_c0,0xffffffff,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
    }
  }
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar31 = Geometry::GetBlendShapes(&mesh->super_Geometry);
  ppBVar7 = (pvVar31->
            super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar32 = (pvVar31->
                  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; pFVar43 = local_a0,
      ppBVar32 != ppBVar7; ppBVar32 = ppBVar32 + 1) {
    ppBVar8 = ((*ppBVar32)->blendShapeChannels).
              super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppBVar40 = ((*ppBVar32)->blendShapeChannels).
                    super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppBVar40 != ppBVar8;
        ppBVar40 = ppBVar40 + 1) {
      local_b0 = *ppBVar40;
      this_02 = &local_b0->shapeGeometries;
      for (local_c0 = (FBXConverter *)0x0;
          local_c0 <
          (FBXConverter *)
          ((long)(local_b0->shapeGeometries).
                 super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_b0->shapeGeometries).
                 super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          local_c0 = (FBXConverter *)((long)&local_c0->defaultMaterialIndex + 1)) {
        animMesh = aiCreateAnimMesh(out);
        pFVar43 = local_c0;
        ppSVar33 = std::
                   vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                   ::at(this_02,(size_type)local_c0);
        this_00 = *ppSVar33;
        local_b8 = (Model *)ShapeGeometry::GetVertices(this_00);
        local_a8 = ShapeGeometry::GetNormals(this_00);
        pvVar19 = ShapeGeometry::GetIndices(this_00);
        paVar16 = animMesh;
        FixAnimMeshName((string *)&tempBinormals,pFVar43,
                        &(this_00->super_Geometry).super_Object.name);
        paVar1 = tempBinormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
            ._M_impl.super__Vector_impl_data._M_finish < (pointer)0x400) {
          (paVar16->mName).length =
               (ai_uint32)
               tempBinormals.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          memcpy((paVar16->mName).data,
                 tempBinormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (size_t)tempBinormals.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
          (paVar16->mName).data[(long)paVar1] = '\0';
        }
        std::__cxx11::string::~string((string *)&tempBinormals);
        for (uVar46 = 0;
            uVar46 < (ulong)((long)(pvVar19->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar19->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
            uVar46 = uVar46 + 1) {
          pvVar34 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(pvVar19,uVar46);
          uVar17 = *pvVar34;
          pvVar35 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               local_b8,uVar46);
          tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(tempBinormals.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,pvVar35->z);
          tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start = *(pointer *)pvVar35;
          pvVar35 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                              (local_a8,uVar46);
          normal.z = pvVar35->z;
          normal.x = pvVar35->x;
          normal.y = pvVar35->y;
          count = 0;
          puVar36 = MeshGeometry::ToOutputVertexIndex(mesh,uVar17,&count);
          for (uVar29 = 0; uVar29 < count; uVar29 = uVar29 + 1) {
            uVar17 = puVar36[uVar29];
            aiVector3t<float>::operator+=
                      (animMesh->mVertices + uVar17,(aiVector3t<float> *)&tempBinormals);
            if (animMesh->mNormals != (aiVector3D *)0x0) {
              aiVector3t<float>::operator+=(animMesh->mNormals + uVar17,&normal);
              aiVector3t<float>::NormalizeSafe(animMesh->mNormals + uVar17);
            }
          }
        }
        fVar48 = 1.0;
        if (8 < (ulong)((long)(local_b0->shapeGeometries).
                              super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_b0->shapeGeometries).
                             super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
          fVar48 = local_b0->percent / 100.0;
        }
        animMesh->mWeight = fVar48;
        std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::push_back(&animMeshes,&animMesh);
      }
    }
  }
  if ((long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar46 = (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    out->mNumAnimMeshes = (uint)uVar46;
    ppaVar37 = (aiAnimMesh **)
               operator_new__(-(ulong)(uVar46 >> 0x3d != 0) |
                              (long)animMeshes.
                                    super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)animMeshes.
                                    super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
    out->mAnimMeshes = ppaVar37;
    for (__n = 0; uVar46 != __n; __n = __n + 1) {
      ppaVar38 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::at(&animMeshes,__n);
      out->mAnimMeshes[__n] = *ppaVar38;
    }
  }
  ppaVar9 = (pFVar43->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppaVar10 = (pFVar43->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::_Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::~_Vector_base
            (&animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>);
  return (int)((ulong)((long)ppaVar9 - (long)ppaVar10) >> 3) - 1;
}

Assistant:

unsigned int FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry& mesh, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, nd);

            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            // copy vertices
            out_mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
            out_mesh->mVertices = new aiVector3D[vertices.size()];

            std::copy(vertices.begin(), vertices.end(), out_mesh->mVertices);

            // generate dummy faces
            out_mesh->mNumFaces = static_cast<unsigned int>(faces.size());
            aiFace* fac = out_mesh->mFaces = new aiFace[faces.size()]();

            unsigned int cursor = 0;
            for (unsigned int pcount : faces) {
                aiFace& f = *fac++;
                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i) {
                    f.mIndices[i] = cursor++;
                }
            }

            // copy normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());

                out_mesh->mNormals = new aiVector3D[vertices.size()];
                std::copy(normals.begin(), normals.end(), out_mesh->mNormals);
            }

            // copy tangents - assimp requires both tangents and bitangents (binormals)
            // to be present, or neither of them. Compute binormals from normals
            // and tangents if needed.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();

            if (tangents.size()) {
                std::vector<aiVector3D> tempBinormals;
                if (!binormals->size()) {
                    if (normals.size()) {
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = NULL;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size());
                    ai_assert(binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    std::copy(tangents.begin(), tangents.end(), out_mesh->mTangents);

                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                    std::copy(binormals->begin(), binormals->end(), out_mesh->mBitangents);
                }
            }

            // copy texture coords
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                aiVector3D* out_uv = out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                for (const aiVector2D& v : uvs) {
                    *out_uv++ = aiVector3D(v.x, v.y, 0.0f);
                }

                out_mesh->mNumUVComponents[i] = 2;
            }

            // copy vertex colors
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
                std::copy(colors.begin(), colors.end(), out_mesh->mColors[i]);
            }

            if (!doc.Settings().readMaterials || mindices.empty()) {
                FBXImporter::LogError("no material assigned to mesh, setting default material");
                out_mesh->mMaterialIndex = GetDefaultMaterial();
            }
            else {
                ConvertMaterialForMesh(out_mesh, model, mesh, mindices[0]);
            }

            if (doc.Settings().readWeights && mesh.DeformerSkin() != NULL) {
                ConvertWeights(out_mesh, model, mesh, node_global_transform, NO_MATERIAL_SEPARATION);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh *animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int index = outIndices[k];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }
            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }
            return static_cast<unsigned int>(meshes.size() - 1);
        }